

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::ReadMicroStringFallback
          (EpsCopyInputStream *this,char *ptr,int size,MicroString *str,Arena *arena)

{
  anon_class_24_3_c2b06966 setter;
  Arena *arena_local;
  MicroString *str_local;
  char *pcStack_18;
  int size_local;
  char *ptr_local;
  EpsCopyInputStream *this_local;
  
  setter.ptr = &stack0xffffffffffffffe8;
  setter.this = this;
  setter.size = (int *)((long)&str_local + 4);
  str_local._4_4_ = size;
  pcStack_18 = ptr;
  ptr_local = (char *)this;
  MicroString::
  SetInChunks<google::protobuf::internal::EpsCopyInputStream::ReadMicroStringFallback(char_const*,int,google::protobuf::internal::MicroString&,google::protobuf::Arena*)::__0>
            (str,(long)size,arena,setter,7);
  return pcStack_18;
}

Assistant:

const char* EpsCopyInputStream::ReadMicroStringFallback(const char* ptr,
                                                        int size,
                                                        MicroString& str,
                                                        Arena* arena) {
  str.SetInChunks(size, arena, [&](auto append) {
    ptr = AppendSize(ptr, size, [&](const char* p, int s) {
      append(absl::string_view(p, s));
    });
  });
  return ptr;
}